

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

value_type * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::at
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this,key *k)

{
  bool bVar1;
  table_type *ptVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  allocator<char> local_39;
  string local_38;
  key *local_18;
  key *k_local;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this_local;
  
  local_18 = k;
  k_local = (key *)this;
  bVar1 = is_table(this);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"toml::value::at(key): ",&local_39);
    detail::
    throw_bad_cast<(toml::value_t)10,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              (&local_38,this->type_,this);
  }
  ptVar2 = basic_value<toml::discard_comments,std::unordered_map,std::vector>::as_table_abi_cxx11_
                     ((basic_value<toml::discard_comments,std::unordered_map,std::vector> *)this,
                      (nothrow_t *)&std::nothrow);
  sVar3 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
          ::count(ptVar2,local_18);
  if (sVar3 == 0) {
    detail::
    throw_key_not_found_error<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              (this,local_18);
  }
  ptVar2 = basic_value<toml::discard_comments,std::unordered_map,std::vector>::as_table_abi_cxx11_
                     ((basic_value<toml::discard_comments,std::unordered_map,std::vector> *)this,
                      (nothrow_t *)&std::nothrow);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
           ::at(ptVar2,local_18);
  return pmVar4;
}

Assistant:

value_type const& at(const key& k) const
    {
        if(!this->is_table())
        {
            detail::throw_bad_cast<value_t::table>(
                "toml::value::at(key): ", this->type_, *this);
        }
        if(this->as_table(std::nothrow).count(k) == 0)
        {
            detail::throw_key_not_found_error(*this, k);
        }
        return this->as_table(std::nothrow).at(k);
    }